

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

_STACK * sk_new(cmp *cmp)

{
  addrinfo *paVar1;
  int __errnum;
  NetSocket *sock;
  char *pcVar2;
  _Bool in_CL;
  _Bool in_DL;
  int in_ESI;
  _Bool in_R8B;
  _Bool in_R9B;
  Plug *in_stack_00000008;
  
  sock = (NetSocket *)safemalloc(1,0x98,0);
  (sock->sock).vt = &NetSocket_sockvt;
  sock->error = (char *)0x0;
  sock->plug = in_stack_00000008;
  bufchain_init(&sock->output_data);
  sock->sending_oob = 0;
  sock->pending_error = 0;
  sock->oobpending = false;
  sock->outgoingeof = EOF_NO;
  sock->incomingeof = false;
  sock->listener = false;
  sock->connected = false;
  sock->writable = false;
  sock->frozen = false;
  sock->localhost_only = false;
  sock->parent = (NetSocket *)0x0;
  sock->child = (NetSocket *)0x0;
  sock->addr = (SockAddr *)cmp;
  (sock->step).ai = *(addrinfo **)(cmp + 0x18);
  (sock->step).curraddr = 0;
  sock->s = -1;
  sock->oobinline = in_CL;
  sock->nodelay = in_R8B;
  sock->keepalive = in_R9B;
  sock->privport = in_DL;
  sock->port = in_ESI;
  while( true ) {
    __errnum = try_connect(sock);
    if (__errnum == 0) {
      return (_STACK *)&sock->sock;
    }
    paVar1 = (sock->step).ai;
    if ((paVar1 == (addrinfo *)0x0) || (paVar1 = paVar1->ai_next, paVar1 == (addrinfo *)0x0)) break;
    (sock->step).ai = paVar1;
  }
  pcVar2 = strerror(__errnum);
  sock->error = pcVar2;
  return (_STACK *)&sock->sock;
}

Assistant:

Socket *sk_new(SockAddr *addr, int port, bool privport, bool oobinline,
               bool nodelay, bool keepalive, Plug *plug)
{
    NetSocket *ret;
    int err;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->connected = false;            /* to start with */
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = false;    /* unused, but best init anyway */
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = false;
    ret->addr = addr;
    START_STEP(ret->addr, ret->step);
    ret->s = -1;
    ret->oobinline = oobinline;
    ret->nodelay = nodelay;
    ret->keepalive = keepalive;
    ret->privport = privport;
    ret->port = port;

    do {
        err = try_connect(ret);
    } while (err && sk_nextaddr(ret->addr, &ret->step));

    if (err)
        ret->error = strerror(err);

    return &ret->sock;
}